

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O1

char * cinatra::detail::parse_headers
                 (char *buf,char *buf_end,http_header *headers,size_t *num_headers,
                 size_t max_headers,int *ret,bool *has_connection,bool *has_close,bool *has_upgrade)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  size_t sVar6;
  bool *pbVar7;
  size_t unaff_R14;
  char *value;
  byte *local_48;
  http_header *local_40;
  size_t local_38;
  
  local_40 = headers;
LAB_0029e8c7:
  pbVar4 = (byte *)buf;
  if (buf != buf_end) {
    bVar1 = *buf;
    if (bVar1 == 10) {
      pbVar4 = (byte *)buf + 1;
      iVar5 = 2;
      goto LAB_0029e922;
    }
    if (bVar1 == 0xd) {
      pbVar4 = (byte *)buf + 1;
      if (pbVar4 == (byte *)buf_end) {
        *ret = -2;
      }
      else {
        pbVar4 = (byte *)buf + 2;
        iVar5 = 2;
        if (((byte *)buf)[1] == 10) goto LAB_0029e922;
        *ret = -1;
      }
      iVar5 = 1;
      goto LAB_0029e922;
    }
    if (*num_headers == max_headers) {
      *ret = -1;
      goto LAB_0029e91a;
    }
    if ((*num_headers == 0) || ((bVar1 != 9 && (bVar1 != 0x20)))) {
      sVar6 = 0;
      pbVar3 = (byte *)buf;
      do {
        if ((ulong)*pbVar3 == 0x3a) {
          if (sVar6 == 0) {
            iVar5 = -1;
            sVar6 = 0;
            goto LAB_0029e9c6;
          }
          pbVar4 = pbVar3 + 1;
          iVar5 = -2;
          pbVar3 = pbVar4;
          if (pbVar4 == (byte *)buf_end) goto LAB_0029e9c6;
          goto LAB_0029e996;
        }
        if (""[*pbVar3] == '\0') {
          iVar5 = -1;
          sVar6 = unaff_R14;
          goto LAB_0029e9c6;
        }
        pbVar3 = pbVar3 + 1;
        sVar6 = sVar6 + 1;
      } while (pbVar3 != (byte *)buf_end);
      iVar5 = -2;
      pbVar3 = (byte *)buf_end;
      sVar6 = unaff_R14;
      goto LAB_0029e9c6;
    }
    buf = (char *)(byte *)0x0;
    unaff_R14 = 0;
    goto LAB_0029e9d7;
  }
  *ret = -2;
LAB_0029e91a:
  iVar5 = 1;
  goto LAB_0029e922;
  while (pbVar4 = pbVar4 + 1, pbVar3 = (byte *)buf_end, pbVar4 != (byte *)buf_end) {
LAB_0029e996:
    if ((*pbVar4 != 0x20) && (*pbVar4 != 9)) {
      bVar2 = true;
      goto LAB_0029e9ca;
    }
  }
LAB_0029e9c6:
  pbVar4 = pbVar3;
  *ret = iVar5;
  bVar2 = false;
LAB_0029e9ca:
  iVar5 = 1;
  unaff_R14 = sVar6;
  if (bVar2) {
LAB_0029e9d7:
    pbVar4 = (byte *)get_token_to_eol((char *)pbVar4,buf_end,(char **)&local_48,&local_38,ret);
    if (pbVar4 == (byte *)0x0) {
      iVar5 = 1;
      pbVar4 = (byte *)0x0;
    }
    else {
      if ((unaff_R14 == 10) &&
         (((byte *)buf)[9] == 0x6e && *(long *)((byte *)buf + 1) == 0x6f697463656e6e6f)) {
        *has_connection = true;
        pbVar7 = has_upgrade;
        if (((*local_48 & 0xdf) == 0x55) || (pbVar7 = has_close, (*local_48 & 0xdf) == 0x43)) {
          *pbVar7 = true;
        }
      }
      sVar6 = *num_headers;
      local_40[sVar6].name._M_len = unaff_R14;
      local_40[sVar6].name._M_str = buf;
      local_40[sVar6].value._M_len = local_38;
      local_40[sVar6].value._M_str = (char *)local_48;
      iVar5 = 0;
    }
  }
LAB_0029e922:
  if (iVar5 != 0) {
    if (iVar5 == 1) {
      pbVar4 = (byte *)0x0;
    }
    return (char *)pbVar4;
  }
  *num_headers = *num_headers + 1;
  buf = (char *)pbVar4;
  goto LAB_0029e8c7;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end,
                                 http_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret,
                                 bool &has_connection, bool &has_close,
                                 bool &has_upgrade) {
  for (;; ++*num_headers) {
    const char *name;
    size_t name_len;
    const char *value;
    size_t value_len;
    CHECK_EOF();
    if (*buf == '\015') {
      ++buf;
      EXPECT_CHAR('\012');
      break;
    }
    else if (*buf == '\012') {
      ++buf;
      break;
    }
    if (*num_headers == max_headers) {
      *ret = -1;
      return NULL;
    }
    if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
      /* parsing name, but do not discard SP before colon, see
       * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
      name = buf;
      static const char ALIGNED(16) ranges1[] =
          "\x00 "  /* control chars and up to SP */
          "\"\""   /* 0x22 */
          "()"     /* 0x28,0x29 */
          ",,"     /* 0x2c */
          "//"     /* 0x2f */
          ":@"     /* 0x3a-0x40 */
          "[]"     /* 0x5b-0x5d */
          "{\377"; /* 0x7b-0xff */
      int found;
      buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
      if (!found) {
        CHECK_EOF();
      }
      while (1) {
        if (*buf == ':') {
          break;
        }
        else if (!token_char_map[(unsigned char)*buf]) {
          *ret = -1;
          return NULL;
        }
        ++buf;
        CHECK_EOF();
      }
      if ((name_len = buf - name) == 0) {
        *ret = -1;
        return NULL;
      }
      ++buf;
      for (;; ++buf) {
        CHECK_EOF();
        if (!(*buf == ' ' || *buf == '\t')) {
          break;
        }
      }
    }
    else {
      name = NULL;
      name_len = 0;
    }
    if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) ==
        NULL) {
      return NULL;
    }
    if (name_len == 10) {
      if (memcmp(name + 1, "onnection", name_len - 1) == 0) {
        // has connection
        has_connection = true;
        char ch = *value;
        if (ch == 'U' || ch == 'u') {
          // has upgrade
          has_upgrade = true;
        }
        else if (ch == 'c' || ch == 'C') {
          // has_close
          has_close = true;
        }
      }
    }
    headers[*num_headers] = {std::string_view{name, name_len},
                             std::string_view{value, value_len}};
  }
  return buf;
}